

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_residual_test.c
# Opt level: O2

void __thiscall lu_residual_test(void *this,lu_int *Bbegin,lu_int *Bend,lu_int *Bi,double *Bx)

{
  uint m;
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double *x;
  double *x_00;
  uint uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  
  m = *(uint *)((long)this + 0x54);
  uVar1 = *(uint *)((long)this + 0x13c);
  lVar14 = (long)(int)uVar1;
  lVar18 = *(long *)((long)this + 0x250);
  lVar4 = *(long *)((long)this + 0x1d8);
  lVar5 = *(long *)((long)this + 0x1e8);
  lVar6 = *(long *)((long)this + 0x278);
  lVar16 = *(long *)((long)this + 0x240);
  lVar17 = *(long *)((long)this + 0x280);
  uVar22 = 0;
  uVar21 = 0;
  if (0 < (int)m) {
    uVar21 = (ulong)m;
  }
  lVar7 = *(long *)((long)this + 0x2b0);
  lVar8 = *(long *)((long)this + 0x1a0);
  lVar9 = *(long *)((long)this + 0x1a8);
  lVar10 = *(long *)((long)this + 0x1b8);
  lVar11 = *(long *)((long)this + 0x1c0);
  x = *(double **)((long)this + 0x298);
  x_00 = *(double **)((long)this + 0x2a0);
  for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
    dVar25 = 0.0;
    for (lVar15 = (long)*(int *)(lVar16 + uVar22 * 4) << 2; lVar19 = (long)*(int *)(lVar8 + lVar15),
        -1 < lVar19; lVar15 = lVar15 + 4) {
      dVar25 = dVar25 + x_00[lVar19] * *(double *)(lVar10 + lVar15 * 2);
    }
    iVar2 = *(int *)(lVar18 + uVar22 * 4);
    dVar23 = *(double *)(&DAT_003990c0 + (ulong)(dVar25 <= 0.0) * 8);
    x[iVar2] = dVar23;
    x_00[iVar2] = dVar23 - dVar25;
  }
  uVar12 = m - 1;
  for (uVar13 = uVar12; -1 < (int)uVar13; uVar13 = uVar13 - 1) {
    lVar16 = (long)*(int *)(lVar5 + (ulong)uVar13 * 4);
    dVar25 = x_00[lVar16] / *(double *)(lVar7 + lVar16 * 8);
    x_00[lVar16] = dVar25;
    for (lVar16 = (long)*(int *)(lVar17 + lVar16 * 4) << 2; lVar15 = (long)*(int *)(lVar9 + lVar16),
        -1 < lVar15; lVar16 = lVar16 + 4) {
      x_00[lVar15] = *(double *)(lVar11 + lVar16 * 2) * -dVar25 + x_00[lVar15];
    }
  }
  uVar22 = 0;
  uVar20 = 0;
  if (0 < (int)uVar1) {
    uVar20 = (ulong)uVar1;
  }
  for (; lVar16 = lVar14, uVar22 != uVar20; uVar22 = uVar22 + 1) {
    iVar2 = *(int *)(lVar4 + uVar22 * 4);
    iVar3 = Bend[iVar2];
    dVar25 = x_00[*(int *)(lVar5 + uVar22 * 4)];
    for (lVar16 = (long)Bbegin[iVar2]; lVar16 < iVar3; lVar16 = lVar16 + 1) {
      x[Bi[lVar16]] = Bx[lVar16] * -dVar25 + x[Bi[lVar16]];
    }
  }
  for (; lVar16 < (int)m; lVar16 = lVar16 + 1) {
    iVar2 = *(int *)(lVar5 + lVar16 * 4);
    x[iVar2] = x[iVar2] - x_00[iVar2];
  }
  dVar25 = lu_onenorm(m,x_00);
  dVar23 = lu_onenorm(m,x);
  for (uVar22 = 0; uVar22 != uVar21; uVar22 = uVar22 + 1) {
    lVar16 = (long)*(int *)(lVar5 + uVar22 * 4);
    dVar26 = 0.0;
    for (lVar15 = (long)*(int *)(lVar17 + lVar16 * 4) << 2; lVar19 = (long)*(int *)(lVar9 + lVar15),
        -1 < lVar19; lVar15 = lVar15 + 4) {
      dVar26 = dVar26 + x_00[lVar19] * *(double *)(lVar11 + lVar15 * 2);
    }
    dVar24 = *(double *)(&DAT_003990c0 + (ulong)(dVar26 <= 0.0) * 8);
    x[lVar16] = dVar24;
    x_00[lVar16] = (dVar24 - dVar26) / *(double *)(lVar7 + lVar16 * 8);
  }
  for (; -1 < (int)uVar12; uVar12 = uVar12 - 1) {
    dVar26 = 0.0;
    for (lVar16 = (long)*(int *)(lVar6 + (ulong)uVar12 * 4) << 2;
        lVar17 = (long)*(int *)(lVar8 + lVar16), -1 < lVar17; lVar16 = lVar16 + 4) {
      dVar26 = dVar26 + x_00[lVar17] * *(double *)(lVar10 + lVar16 * 2);
    }
    iVar2 = *(int *)(lVar18 + (ulong)uVar12 * 4);
    x_00[iVar2] = x_00[iVar2] - dVar26;
  }
  for (uVar22 = 0; uVar22 != uVar20; uVar22 = uVar22 + 1) {
    iVar2 = *(int *)(lVar5 + uVar22 * 4);
    iVar3 = *(int *)(lVar4 + uVar22 * 4);
    dVar26 = 0.0;
    for (lVar18 = (long)Bbegin[iVar3]; lVar18 < Bend[iVar3]; lVar18 = lVar18 + 1) {
      dVar26 = dVar26 + x_00[Bi[lVar18]] * Bx[lVar18];
    }
    x[iVar2] = x[iVar2] - dVar26;
  }
  for (; lVar14 < (int)m; lVar14 = lVar14 + 1) {
    iVar2 = *(int *)(lVar5 + lVar14 * 4);
    x[iVar2] = x[iVar2] - x_00[iVar2];
  }
  dVar26 = lu_onenorm(m,x_00);
  dVar24 = lu_onenorm(m,x);
  lu_matrix_norm(this,Bbegin,Bend,Bi,Bx);
  dVar25 = fmax(dVar23 / (dVar25 * *(double *)((long)this + 0x120) + (double)(int)m),
                dVar24 / (dVar26 * *(double *)((long)this + 0x128) + (double)(int)m));
  *(double *)((long)this + 0x130) = dVar25;
  for (uVar22 = 0; uVar21 != uVar22; uVar22 = uVar22 + 1) {
    x[uVar22] = 0.0;
  }
  return;
}

Assistant:

void lu_residual_test(
    struct lu *this, const lu_int *Bbegin, const lu_int *Bend, const lu_int *Bi,
    const double *Bx)
{
    const lu_int m                  = this->m;
    const lu_int rank               = this->rank;
    const lu_int *p                 = this->p;
    const lu_int *pivotcol          = this->pivotcol;
    const lu_int *pivotrow          = this->pivotrow;
    const lu_int *Lbegin_p          = this->Lbegin_p;
    const lu_int *Ltbegin_p         = this->Ltbegin_p;
    const lu_int *Ubegin            = this->Ubegin;
    const double *row_pivot         = this->row_pivot;
    const lu_int *Lindex            = this->Lindex;
    const double *Lvalue            = this->Lvalue;
    const lu_int *Uindex            = this->Uindex;
    const double *Uvalue            = this->Uvalue;
    double *rhs                     = this->work0;
    double *lhs                     = this->work1;

    lu_int i, k, ipivot, jpivot, pos;
    double norm_ftran, norm_ftran_res, norm_btran, norm_btran_res, d;

    assert(this->nupdate == 0);

    /* --------------------------------- */
    /* Residual Test with Forward System */
    /* --------------------------------- */

    /* Compute lhs = L\rhs and build rhs on-the-fly. */
    for (k = 0; k < m; k++)
    {
        d = 0.0;
        for (pos = Ltbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
        {
            d += lhs[i] * Lvalue[pos];
        }
        ipivot = p[k];
        rhs[ipivot] = d <= 0.0 ? 1.0 : -1.0;
        lhs[ipivot] = rhs[ipivot] - d;
    }

    /* Overwrite lhs by U\lhs. */
    for (k = m-1; k >= 0; k--)
    {
        ipivot = pivotrow[k];
        d = lhs[ipivot] /= row_pivot[ipivot];
        for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
        {
            lhs[i] -= d * Uvalue[pos];
        }
    }

    /* Overwrite rhs by the residual rhs-B*lhs. */
    for (k = 0; k < rank; k++)
    {
        ipivot = pivotrow[k];
        jpivot = pivotcol[k];
        d = lhs[ipivot];
        for (pos = Bbegin[jpivot]; pos < Bend[jpivot]; pos++)
        {
            rhs[Bi[pos]] -= d * Bx[pos];
        }
    }
    for (k = rank; k < m; k++)
    {
        ipivot = pivotrow[k];
        rhs[ipivot] -= lhs[ipivot];
    }
    norm_ftran = lu_onenorm(m, lhs);
    norm_ftran_res = lu_onenorm(m, rhs);

    /* ---------------------------------- */
    /* Residual Test with Backward System */
    /* ---------------------------------- */

    /* Compute lhs = U'\rhs and build rhs on-the-fly. */
    for (k = 0; k < m; k++)
    {
        ipivot = pivotrow[k];
        d = 0.0;
        for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
        {
            d += lhs[i] * Uvalue[pos];
        }
        rhs[ipivot] = d <= 0.0 ? 1.0 : -1.0;
        lhs[ipivot] = (rhs[ipivot] - d) / row_pivot[ipivot];
    }

    /* Overwrite lhs by L'\lhs. */
    for (k = m-1; k >= 0; k--)
    {
        d = 0.0;
        for (pos = Lbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
        {
            d += lhs[i] * Lvalue[pos];
        }
        lhs[p[k]] -= d;
    }

    /* Overwrite rhs by the residual rhs-B'*lhs. */
    for (k = 0; k < rank; k++)
    {
        ipivot = pivotrow[k];
        jpivot = pivotcol[k];
        d = 0.0;
        for (pos = Bbegin[jpivot]; pos < Bend[jpivot]; pos++)
        {
            d += lhs[Bi[pos]] * Bx[pos];
        }
        rhs[ipivot] -= d;
    }
    for (k = rank; k < m; k++)
    {
        ipivot = pivotrow[k];
        rhs[ipivot] -= lhs[ipivot];
    }
    norm_btran = lu_onenorm(m, lhs);
    norm_btran_res = lu_onenorm(m, rhs);

    /* -------- */
    /* Finalize */
    /* -------- */

    lu_matrix_norm(this, Bbegin, Bend, Bi, Bx);
    assert(this->onenorm > 0.0);
    assert(this->infnorm > 0.0);
    this->residual_test = fmax(norm_ftran_res / (m + this->onenorm*norm_ftran),
                               norm_btran_res / (m + this->infnorm*norm_btran));

    /* reset workspace */
    for (i = 0; i < m; i++) rhs[i] = 0;
}